

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O3

int run_test_getaddrinfo_basic_sync(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  undefined4 *puVar3;
  addrinfo *ai;
  long extraout_RDX;
  uv_getaddrinfo_t *req_00;
  uv_loop_t *puVar4;
  uv_handle_t *handle;
  int *piVar5;
  long lVar6;
  uv_getaddrinfo_t req;
  uv_getaddrinfo_t uStack_a8;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,&uStack_a8,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_a8.addrinfo);
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  req_00 = getaddrinfo_handles;
  piVar5 = callback_counts;
  lVar6 = 0;
  do {
    *piVar5 = 0;
    puVar2 = (uv_loop_t *)0x4;
    puVar3 = (undefined4 *)malloc(4);
    if (puVar3 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015906c:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_00159071;
    }
    *puVar3 = (int)lVar6;
    req_00->data = puVar3;
    puVar2 = uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar2,req_00,getaddrinfo_cuncurrent_cb,"localhost",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar1 != 0) goto LAB_0015906c;
    lVar6 = lVar6 + 1;
    req_00 = req_00 + 1;
    piVar5 = piVar5 + 1;
  } while (lVar6 != 10);
  puVar2 = uv_default_loop();
  lVar6 = 0;
  uv_run(puVar2,UV_RUN_DEFAULT);
  do {
    if (*(int *)((long)callback_counts + lVar6) != 1) goto LAB_00159071;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x28);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
LAB_00159076:
  run_test_getaddrinfo_concurrent_cold_3();
  handle = (uv_handle_t *)puVar2->data;
  piVar5 = callback_counts;
  puVar4 = (uv_loop_t *)&closedir_req.bufsml[1].len;
  lVar6 = 0;
  do {
    puVar4 = (uv_loop_t *)((puVar4->wq_mutex).__size + 0x18);
    if (puVar4 == puVar2) goto LAB_001590b3;
    piVar5 = piVar5 + 1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar6 = extraout_RDX;
LAB_001590b3:
  if (*(int *)&handle->data == (int)lVar6) {
    *piVar5 = *piVar5 + 1;
    free(handle);
    uv_freeaddrinfo(ai);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return extraout_EAX;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_00;
LAB_00159071:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_00159076;
}

Assistant:

TEST_IMPL(getaddrinfo_basic_sync) {
  uv_getaddrinfo_t req;

  ASSERT(0 == uv_getaddrinfo(uv_default_loop(),
                             &req,
                             NULL,
                             name,
                             NULL,
                             NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY();
  return 0;
}